

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O1

void __thiscall
cmCTestBuildHandler::GenerateXMLLogScraped(cmCTestBuildHandler *this,cmXMLWriter *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCTest *this_00;
  char *pcVar2;
  _Alloc_hider _Var3;
  string *psVar4;
  cmXMLWriter *pcVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  pointer pcVar10;
  int iVar11;
  pointer pcVar12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string srcdir;
  string local_118;
  byte local_e1;
  string *local_e0;
  cmCTestBuildHandler *local_d8;
  int local_d0;
  int local_cc;
  pointer local_c8;
  cmXMLWriter *local_c0;
  string *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  iVar7 = this->MaxErrors;
  iVar11 = this->MaxWarnings;
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  paVar1 = &local_118.field_2;
  local_118._M_dataplus._M_p = (pointer)paVar1;
  local_d8 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"SourceDirectory","");
  cmCTest::GetCTestConfiguration(&local_b0,this_00,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  cmsys::SystemTools::CollapseFullPath(&local_90,&local_b0);
  local_118._M_dataplus._M_p = &DAT_00000001;
  local_118.field_2._M_local_buf[0] = '/';
  local_50._M_len = local_90._M_string_length;
  local_50._M_str = local_90._M_dataplus._M_p;
  local_40 = 1;
  views._M_len = 2;
  views._M_array = &local_50;
  local_118._M_string_length = (size_type)paVar1;
  local_38 = paVar1;
  cmCatViews_abi_cxx11_(&local_70,views);
  std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pcVar10 = (local_d8->ErrorsAndWarnings).
            super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar5 = xml;
  if (pcVar10 !=
      (local_d8->ErrorsAndWarnings).
      super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_c0 = pcVar5;
      if (iVar7 == 0 && iVar11 == 0) break;
      iVar8 = iVar11;
      if (pcVar10->Error != false) {
        iVar8 = iVar7;
      }
      if (iVar8 != 0) {
        iVar8 = 0x7f3f38;
        if (pcVar10->Error != false) {
          iVar8 = 0x7e0eae;
        }
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        local_e1 = pcVar10->Error;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,iVar8,iVar8 + (pcVar10->Error ^ 1) * 2 + 5);
        cmXMLWriter::StartElement(xml,&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,
                          CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                   local_118.field_2._M_local_buf[0]) + 1);
        }
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"BuildLogLine","");
        cmXMLWriter::Element<int>(xml,&local_118,&pcVar10->LogLine);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,
                          CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                   local_118.field_2._M_local_buf[0]) + 1);
        }
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Text","");
        cmXMLWriter::StartElement(xml,&local_118);
        local_b8 = &pcVar10->Text;
        cmXMLWriter::Content<std::__cxx11::string>(xml,local_b8);
        cmXMLWriter::EndElement(xml);
        local_d0 = iVar11;
        local_cc = iVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,
                          CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                   local_118.field_2._M_local_buf[0]) + 1);
        }
        pcVar12 = (local_d8->ErrorWarningFileLineRegex).
                  super__Vector_base<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_c8 = (local_d8->ErrorWarningFileLineRegex).
                   super__Vector_base<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (pcVar12 != local_c8) {
          local_e0 = &pcVar10->SourceFile;
          do {
            while (bVar6 = cmsys::RegularExpression::find
                                     (&pcVar12->RegularExpression,(local_b8->_M_dataplus)._M_p,
                                      &(pcVar12->RegularExpression).regmatch), bVar6) {
              pcVar2 = (pcVar12->RegularExpression).regmatch.startp[pcVar12->FileIndex];
              if (pcVar2 == (char *)0x0) {
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                local_118._M_string_length = 0;
                local_118.field_2._M_local_buf[0] = '\0';
              }
              else {
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_118,pcVar2,
                           (pcVar12->RegularExpression).regmatch.endp[pcVar12->FileIndex]);
              }
              std::__cxx11::string::operator=((string *)local_e0,(string *)&local_118);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                         local_118.field_2._M_local_buf[0]) + 1);
              }
              cmsys::SystemTools::ConvertToUnixSlashes(local_e0);
              psVar4 = local_e0;
              lVar9 = std::__cxx11::string::find((char *)local_e0,0x7f3413,0);
              if (lVar9 == -1) {
                cmsys::SystemTools::CollapseFullPath(&local_118,psVar4);
                std::__cxx11::string::operator=((string *)psVar4,(string *)&local_118);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                           local_118.field_2._M_local_buf[0]) + 1);
                }
                cmsys::SystemTools::ReplaceString(psVar4,local_b0._M_dataplus._M_p,"");
              }
              else {
                cmsys::SystemTools::ReplaceString(psVar4,"/.../","");
                lVar9 = std::__cxx11::string::find((char)local_e0,0x2f);
                psVar4 = local_e0;
                if (lVar9 != -1) {
                  std::__cxx11::string::substr((ulong)&local_118,(ulong)local_e0);
                  std::__cxx11::string::operator=((string *)psVar4,(string *)&local_118);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    operator_delete(local_118._M_dataplus._M_p,
                                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                             local_118.field_2._M_local_buf[0]) + 1);
                  }
                }
              }
              pcVar2 = (pcVar12->RegularExpression).regmatch.startp[pcVar12->LineIndex];
              if (pcVar2 == (char *)0x0) {
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                local_118._M_string_length = 0;
                local_118.field_2._M_local_buf[0] = '\0';
              }
              else {
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_118,pcVar2,
                           (pcVar12->RegularExpression).regmatch.endp[pcVar12->LineIndex]);
              }
              _Var3._M_p = local_118._M_dataplus._M_p;
              iVar7 = atoi(local_118._M_dataplus._M_p);
              pcVar10->LineNumber = iVar7;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var3._M_p != &local_118.field_2) {
                operator_delete(_Var3._M_p,
                                CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                         local_118.field_2._M_local_buf[0]) + 1);
              }
              pcVar12 = pcVar12 + 1;
              if (bVar6 || pcVar12 == local_c8) goto LAB_00550894;
            }
            pcVar12 = pcVar12 + 1;
          } while (pcVar12 != local_c8);
        }
LAB_00550894:
        xml = local_c0;
        iVar7 = local_cc;
        if (((pcVar10->SourceFile)._M_string_length != 0) && (-1 < pcVar10->LineNumber)) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"SourceFile","");
          cmXMLWriter::StartElement(xml,&local_118);
          cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar10->SourceFile);
          cmXMLWriter::EndElement(xml);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,
                            CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                     local_118.field_2._M_local_buf[0]) + 1);
          }
          if ((pcVar10->SourceFileTail)._M_string_length != 0) {
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_118,"SourceFileTail","");
            cmXMLWriter::StartElement(xml,&local_118);
            cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar10->SourceFileTail);
            cmXMLWriter::EndElement(xml);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,
                              CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                       local_118.field_2._M_local_buf[0]) + 1);
            }
          }
          if (-1 < pcVar10->LineNumber) {
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_118,"SourceLineNumber","");
            cmXMLWriter::Element<int>(xml,&local_118,&pcVar10->LineNumber);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,
                              CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                       local_118.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"PreContext","");
        cmXMLWriter::StartElement(xml,&local_118);
        iVar11 = local_d0;
        cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar10->PreContext);
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,
                          CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                   local_118.field_2._M_local_buf[0]) + 1);
        }
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"PostContext","");
        cmXMLWriter::StartElement(xml,&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,
                          CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                   local_118.field_2._M_local_buf[0]) + 1);
        }
        cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar10->PostContext);
        iVar11 = iVar11 - (uint)(local_e1 ^ 1);
        iVar7 = iVar7 - (uint)local_e1;
        iVar8 = iVar11;
        if (pcVar10->Error != false) {
          iVar8 = iVar7;
        }
        if (iVar8 == 0) {
          cmXMLWriter::Content<char[72]>
                    (xml,(char (*) [72])
                         "\nThe maximum number of reported warnings or errors has been reached!!!\n"
                    );
        }
        cmXMLWriter::EndElement(xml);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"RepeatCount","");
        cmXMLWriter::StartElement(xml,&local_118);
        cmXMLWriter::Content<char[2]>(xml,(char (*) [2])0x7b5812);
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,
                          CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                   local_118.field_2._M_local_buf[0]) + 1);
        }
        cmXMLWriter::EndElement(xml);
      }
      pcVar10 = pcVar10 + 1;
      pcVar5 = local_c0;
    } while (pcVar10 !=
             (local_d8->ErrorsAndWarnings).
             super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestBuildHandler::GenerateXMLLogScraped(cmXMLWriter& xml)
{
  std::vector<cmCTestBuildErrorWarning>& ew = this->ErrorsAndWarnings;
  std::vector<cmCTestBuildErrorWarning>::iterator it;

  // only report the first 50 warnings and first 50 errors
  int numErrorsAllowed = this->MaxErrors;
  int numWarningsAllowed = this->MaxWarnings;
  std::string srcdir = this->CTest->GetCTestConfiguration("SourceDirectory");
  // make sure the source dir is in the correct case on windows
  // via a call to collapse full path.
  srcdir = cmStrCat(cmSystemTools::CollapseFullPath(srcdir), '/');
  for (it = ew.begin();
       it != ew.end() && (numErrorsAllowed || numWarningsAllowed); it++) {
    cmCTestBuildErrorWarning* cm = &(*it);
    if ((cm->Error && numErrorsAllowed) ||
        (!cm->Error && numWarningsAllowed)) {
      if (cm->Error) {
        numErrorsAllowed--;
      } else {
        numWarningsAllowed--;
      }
      xml.StartElement(cm->Error ? "Error" : "Warning");
      xml.Element("BuildLogLine", cm->LogLine);
      xml.Element("Text", cm->Text);
      for (cmCTestCompileErrorWarningRex& rit :
           this->ErrorWarningFileLineRegex) {
        cmsys::RegularExpression* re = &rit.RegularExpression;
        if (re->find(cm->Text)) {
          cm->SourceFile = re->match(rit.FileIndex);
          // At this point we need to make this->SourceFile relative to
          // the source root of the project, so cvs links will work
          cmSystemTools::ConvertToUnixSlashes(cm->SourceFile);
          if (cm->SourceFile.find("/.../") != std::string::npos) {
            cmSystemTools::ReplaceString(cm->SourceFile, "/.../", "");
            std::string::size_type p = cm->SourceFile.find('/');
            if (p != std::string::npos) {
              cm->SourceFile =
                cm->SourceFile.substr(p + 1, cm->SourceFile.size() - p);
            }
          } else {
            // make sure it is a full path with the correct case
            cm->SourceFile = cmSystemTools::CollapseFullPath(cm->SourceFile);
            cmSystemTools::ReplaceString(cm->SourceFile, srcdir.c_str(), "");
          }
          cm->LineNumber = atoi(re->match(rit.LineIndex).c_str());
          break;
        }
      }
      if (!cm->SourceFile.empty() && cm->LineNumber >= 0) {
        if (!cm->SourceFile.empty()) {
          xml.Element("SourceFile", cm->SourceFile);
        }
        if (!cm->SourceFileTail.empty()) {
          xml.Element("SourceFileTail", cm->SourceFileTail);
        }
        if (cm->LineNumber >= 0) {
          xml.Element("SourceLineNumber", cm->LineNumber);
        }
      }
      xml.Element("PreContext", cm->PreContext);
      xml.StartElement("PostContext");
      xml.Content(cm->PostContext);
      // is this the last warning or error, if so notify
      if ((cm->Error && !numErrorsAllowed) ||
          (!cm->Error && !numWarningsAllowed)) {
        xml.Content("\nThe maximum number of reported warnings or errors "
                    "has been reached!!!\n");
      }
      xml.EndElement(); // PostContext
      xml.Element("RepeatCount", "0");
      xml.EndElement(); // "Error" / "Warning"
    }
  }
}